

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

float * stbi__loadf_main(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  int a;
  int b;
  int iVar1;
  float *pfVar2;
  uchar *__ptr;
  long lVar3;
  char *pcVar4;
  int *piVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  stbi__result_info *in_R9;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  uchar *puVar12;
  float *pfVar13;
  long *in_FS_OFFSET;
  bool bVar14;
  float fVar15;
  
  iVar1 = stbi__hdr_test(s);
  if (iVar1 == 0) {
    piVar5 = comp;
    iVar1 = req_comp;
    __ptr = stbi__load_and_postprocess_8bit(s,x,y,comp,req_comp);
    if (__ptr == (uchar *)0x0) {
      pcVar4 = "unknown image type";
    }
    else {
      a = *x;
      b = *y;
      if (req_comp == 0) {
        req_comp = *comp;
      }
      pfVar2 = (float *)stbi__malloc_mad4(a,b,req_comp,(int)piVar5,iVar1);
      if (pfVar2 != (float *)0x0) {
        uVar6 = req_comp - (uint)((req_comp & 1U) == 0);
        uVar10 = b * a;
        lVar7 = (long)req_comp;
        uVar11 = (ulong)(~((int)uVar10 >> 0x1f) & uVar10);
        puVar12 = __ptr;
        pfVar13 = pfVar2;
        for (uVar8 = 0; uVar8 != uVar11; uVar8 = uVar8 + 1) {
          for (uVar9 = 0; (~((int)uVar6 >> 0x1f) & uVar6) != uVar9; uVar9 = uVar9 + 1) {
            fVar15 = powf((float)puVar12[uVar9] / 255.0,stbi__l2h_gamma);
            pfVar13[uVar9] = fVar15 * stbi__l2h_scale;
          }
          pfVar13 = pfVar13 + lVar7;
          puVar12 = puVar12 + lVar7;
        }
        if ((req_comp & 1U) == 0) {
          lVar3 = (long)(int)uVar6;
          while (bVar14 = uVar11 != 0, uVar11 = uVar11 - 1, bVar14) {
            pfVar2[lVar3] = (float)__ptr[lVar3] / 255.0;
            lVar3 = lVar3 + lVar7;
          }
        }
        free(__ptr);
        return pfVar2;
      }
      free(__ptr);
      pcVar4 = "outofmem";
    }
    pfVar2 = (float *)0x0;
    in_FS_OFFSET[-2] = (long)pcVar4;
  }
  else {
    pfVar2 = stbi__hdr_load(s,x,y,comp,req_comp,in_R9);
    if (pfVar2 != (float *)0x0) {
      piVar5 = &stbi__vertically_flip_on_load_global;
      if (*(int *)((long)in_FS_OFFSET + -4) != 0) {
        piVar5 = (int *)(*in_FS_OFFSET + -8);
      }
      if (*piVar5 != 0) {
        if (req_comp == 0) {
          req_comp = *comp;
        }
        stbi__vertical_flip(pfVar2,*x,*y,req_comp << 2);
      }
    }
  }
  return pfVar2;
}

Assistant:

static float *stbi__loadf_main(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   unsigned char *data;
   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      stbi__result_info ri;
      float *hdr_data = stbi__hdr_load(s,x,y,comp,req_comp, &ri);
      if (hdr_data)
         stbi__float_postprocess(hdr_data,x,y,comp,req_comp);
      return hdr_data;
   }
   #endif
   data = stbi__load_and_postprocess_8bit(s, x, y, comp, req_comp);
   if (data)
      return stbi__ldr_to_hdr(data, *x, *y, req_comp ? req_comp : *comp);
   return stbi__errpf("unknown image type", "Image not of any known type, or corrupt");
}